

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::CurrencySymbols::CurrencySymbols
          (CurrencySymbols *this,CurrencyUnit *currency,Locale *locale,UErrorCode *status)

{
  StringPiece local_40;
  
  CurrencyUnit::CurrencyUnit(&this->fCurrency,currency);
  StringPiece::StringPiece(&local_40,locale->fullName);
  MaybeStackArray<char,_40>::MaybeStackArray(&(this->fLocaleName).buffer);
  (this->fLocaleName).len = 0;
  *(this->fLocaleName).buffer.ptr = '\0';
  CharString::append(&this->fLocaleName,local_40.ptr_,local_40.length_,status);
  (this->fCurrencySymbol).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003c0258;
  (this->fCurrencySymbol).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fIntlCurrencySymbol).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003c0258;
  (this->fIntlCurrencySymbol).fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::setToBogus(&this->fCurrencySymbol);
  UnicodeString::setToBogus(&this->fIntlCurrencySymbol);
  return;
}

Assistant:

CurrencySymbols::CurrencySymbols(CurrencyUnit currency, const Locale& locale, UErrorCode& status)
        : fCurrency(currency), fLocaleName(locale.getName(), status) {
    fCurrencySymbol.setToBogus();
    fIntlCurrencySymbol.setToBogus();
}